

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool BasicBlock::IsLegalForPathDepBranches(Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  BranchInstr *this;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  bool local_41;
  bool local_31;
  BranchInstr *branch;
  Instr *instr_local;
  
  branch = (BranchInstr *)instr;
  while( true ) {
    if (branch == (BranchInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1244,"((0))","UNREACHED");
      if (bVar2) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return false;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar2 = IR::Instr::IsBranchInstr(&branch->super_Instr);
    if (!bVar2) {
      IVar3 = IR::Instr::GetKind(&branch->super_Instr);
      local_31 = true;
      if (IVar3 != InstrKindLabel) {
        local_31 = IR::Instr::IsProfiledLabelInstr(&branch->super_Instr);
      }
      if ((local_31 == false) &&
         (bVar2 = IsLegalOpcodeForPathDepBrFold(&branch->super_Instr), !bVar2)) {
        return false;
      }
    }
    IVar3 = IR::Instr::GetKind(&branch->super_Instr);
    local_41 = true;
    if (IVar3 != InstrKindLabel) {
      local_41 = IR::Instr::IsProfiledLabelInstr(&branch->super_Instr);
    }
    if ((local_41 != false) &&
       (pLVar4 = IR::Instr::AsLabelInstr(&branch->super_Instr), (pLVar4->field_0x78 & 1) != 0))
    break;
    bVar2 = IR::Instr::IsBranchInstr(&branch->super_Instr);
    if (bVar2) {
      this = IR::Instr::AsBranchInstr(&branch->super_Instr);
      bVar2 = IR::BranchInstr::IsUnconditional(this);
      if (!bVar2) {
        return true;
      }
      pLVar4 = IR::BranchInstr::GetTarget(this);
      if (pLVar4 == (LabelInstr *)0x0) {
        return false;
      }
      branch = (BranchInstr *)IR::BranchInstr::GetTarget(this);
    }
    else {
      branch = (BranchInstr *)(branch->super_Instr).m_next;
    }
  }
  return false;
}

Assistant:

bool
BasicBlock::IsLegalForPathDepBranches(IR::Instr* instr)
{
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return false;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return false;
            }
        }
        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            if (branch->IsUnconditional())
            {
                if (!branch->GetTarget())
                {
                    return false;
                }
                instr = branch->GetTarget();
            }
            else
            {
                // Found only legal instructions until a conditional branch, build expensive data structures and check provability
                return true;
            }
        }
        else
        {
            instr = instr->m_next;
        }
    }

    Assert(UNREACHED);
    return false;
}